

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_2da2744::Impl::registerHandler
          (Impl *this,TypeInfo *typeinfo,GenericRequestHandler *handler)

{
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_dap::TypeInfo_*,_std::function<void_(const_void_*,_const_std::function<void_(const_dap::TypeInfo_*,_const_void_*)>_&,_const_std::function<void_(const_dap::TypeInfo_*,_const_dap::Error_&)>_&)>_>_>,_false,_true>,_bool>
  pVar1;
  unique_lock<std::mutex> lock;
  TypeInfo *local_80;
  undefined1 local_78 [16];
  code *local_68;
  long *local_58 [2];
  long local_48 [2];
  unique_lock<std::mutex> local_38;
  
  local_38._M_device = &(this->handlers).requestMutex;
  local_38._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_38);
  local_38._M_owns = true;
  (*typeinfo->_vptr_TypeInfo[2])(local_58,typeinfo);
  local_80 = typeinfo;
  std::
  function<void_(const_void_*,_const_std::function<void_(const_dap::TypeInfo_*,_const_void_*)>_&,_const_std::function<void_(const_dap::TypeInfo_*,_const_dap::Error_&)>_&)>
  ::function((function<void_(const_void_*,_const_std::function<void_(const_dap::TypeInfo_*,_const_void_*)>_&,_const_std::function<void_(const_dap::TypeInfo_*,_const_dap::Error_&)>_&)>
              *)local_78,handler);
  pVar1 = std::
          _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::pair<dap::TypeInfo_const*,std::function<void(void_const*,std::function<void(dap::TypeInfo_const*,void_const*)>const&,std::function<void(dap::TypeInfo_const*,dap::Error_const&)>const&)>>>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<dap::TypeInfo_const*,std::function<void(void_const*,std::function<void(dap::TypeInfo_const*,void_const*)>const&,std::function<void(dap::TypeInfo_const*,dap::Error_const&)>const&)>>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
          ::
          _M_emplace<std::__cxx11::string,std::pair<dap::TypeInfo_const*,std::function<void(void_const*,std::function<void(dap::TypeInfo_const*,void_const*)>const&,std::function<void(dap::TypeInfo_const*,dap::Error_const&)>const&)>>>
                    ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::pair<dap::TypeInfo_const*,std::function<void(void_const*,std::function<void(dap::TypeInfo_const*,void_const*)>const&,std::function<void(dap::TypeInfo_const*,dap::Error_const&)>const&)>>>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<dap::TypeInfo_const*,std::function<void(void_const*,std::function<void(dap::TypeInfo_const*,void_const*)>const&,std::function<void(dap::TypeInfo_const*,dap::Error_const&)>const&)>>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                      *)&(this->handlers).requestMap,local_58,&local_80);
  if (local_68 != (code *)0x0) {
    (*local_68)((_Any_data *)local_78,(_Any_data *)local_78,__destroy_functor);
  }
  if (local_58[0] != local_48) {
    operator_delete(local_58[0],local_48[0] + 1);
  }
  if (((undefined1  [16])pVar1 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    (*typeinfo->_vptr_TypeInfo[2])(&local_80,typeinfo);
    EventHandlers::errorfLocked
              (&this->handlers,"Request handler for \'%s\' already registered",local_80);
    if (local_80 != (TypeInfo *)(local_78 + 8)) {
      operator_delete(local_80,local_78._8_8_ + 1);
    }
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_38);
  return;
}

Assistant:

void registerHandler(const dap::TypeInfo* typeinfo,
                       const GenericRequestHandler& handler) override {
    handlers.put(typeinfo, handler);
  }